

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::AddFunctionBlocker(cmMakefile *this,cmFunctionBlocker *fb)

{
  pointer *pppcVar1;
  iterator __position;
  cmFunctionBlocker *local_68;
  cmListFileContext local_60;
  
  local_68 = fb;
  if ((this->CallStack).
      super__Vector_base<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->CallStack).
      super__Vector_base<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    GetExecutionContext(&local_60,this);
    std::__cxx11::string::_M_assign((string *)&fb->StartingContext);
    std::__cxx11::string::_M_assign((string *)&(fb->StartingContext).FilePath);
    (fb->StartingContext).Line = local_60.Line;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.FilePath._M_dataplus._M_p != &local_60.FilePath.field_2) {
      operator_delete(local_60.FilePath._M_dataplus._M_p,
                      local_60.FilePath.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.Name._M_dataplus._M_p != &local_60.Name.field_2) {
      operator_delete(local_60.Name._M_dataplus._M_p,local_60.Name.field_2._M_allocated_capacity + 1
                     );
    }
  }
  __position._M_current =
       (this->FunctionBlockers).
       super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->FunctionBlockers).
      super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmFunctionBlocker*,std::allocator<cmFunctionBlocker*>>::
    _M_realloc_insert<cmFunctionBlocker*const&>
              ((vector<cmFunctionBlocker*,std::allocator<cmFunctionBlocker*>> *)
               &this->FunctionBlockers,__position,&local_68);
  }
  else {
    *__position._M_current = local_68;
    pppcVar1 = &(this->FunctionBlockers).
                super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  return;
}

Assistant:

void cmMakefile::AddFunctionBlocker(cmFunctionBlocker* fb)
{
  if(!this->CallStack.empty())
    {
    // Record the context in which the blocker is created.
    fb->SetStartingContext(this->GetExecutionContext());
    }

  this->FunctionBlockers.push_back(fb);
}